

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

void ma_channel_map_apply_f32
               (float *pFramesOut,ma_channel *pChannelMapOut,ma_uint32 channelsOut,float *pFramesIn,
               ma_channel *pChannelMapIn,ma_uint32 channelsIn,ma_uint64 frameCount,
               ma_channel_mix_mode mode,ma_mono_expansion_mode monoExpansionMode)

{
  ma_channel mVar1;
  ma_channel mVar2;
  ma_channel_conversion_path mVar3;
  ma_result mVar4;
  float fVar5;
  float fVar6;
  float local_1164;
  ma_channel channelIn_1;
  float fStack_1160;
  ma_channel channelOut_1;
  float accumulation_1;
  float accumulation;
  ma_channel channelIn;
  ma_channel channelOut;
  float weights [32] [32];
  uint local_150;
  ma_uint32 iChannelIn;
  ma_uint32 iChannelOut;
  ma_uint32 iFrame;
  ma_channel shuffleTable [254];
  ma_result result;
  ma_channel_conversion_path conversionPath;
  ma_uint32 channelsIn_local;
  ma_channel *pChannelMapIn_local;
  float *pFramesIn_local;
  ma_uint32 channelsOut_local;
  ma_channel *pChannelMapOut_local;
  float *pFramesOut_local;
  
  mVar3 = ma_channel_map_get_conversion_path
                    (pChannelMapIn,channelsIn,pChannelMapOut,channelsOut,mode);
  if (mVar3 == ma_channel_conversion_path_passthrough) {
    ma_copy_pcm_frames(pFramesOut,pFramesIn,frameCount,ma_format_f32,channelsOut);
  }
  else if (mVar3 == ma_channel_conversion_path_mono_out) {
    ma_channel_map_apply_mono_out_f32(pFramesOut,pFramesIn,pChannelMapIn,channelsIn,frameCount);
  }
  else if (mVar3 == ma_channel_conversion_path_mono_in) {
    ma_channel_map_apply_mono_in_f32
              (pFramesOut,pChannelMapOut,channelsOut,pFramesIn,frameCount,monoExpansionMode);
  }
  else if (channelsOut < 0xff) {
    if (mode == ma_channel_mix_mode_simple) {
      mVar4 = ma_channel_map_build_shuffle_table
                        (pChannelMapIn,channelsIn,pChannelMapOut,channelsOut,
                         (ma_uint8 *)&iChannelOut);
      if (mVar4 == MA_SUCCESS) {
        ma_channel_map_apply_shuffle_table
                  (pFramesOut,channelsOut,pFramesIn,channelsIn,frameCount,(ma_uint8 *)&iChannelOut,
                   ma_format_f32);
      }
    }
    else {
      pChannelMapIn_local = (ma_channel *)pFramesIn;
      pChannelMapOut_local = (ma_channel *)pFramesOut;
      if ((channelsIn < 0x21) && (channelsOut < 0x21)) {
        for (local_150 = 0; local_150 < channelsOut; local_150 = local_150 + 1) {
          mVar1 = ma_channel_map_get_channel(pChannelMapOut,channelsOut,local_150);
          for (weights[0x1f][0x1f] = 0.0; (uint)weights[0x1f][0x1f] < channelsIn;
              weights[0x1f][0x1f] = (float)((int)weights[0x1f][0x1f] + 1)) {
            mVar2 = ma_channel_map_get_channel
                              (pChannelMapIn,channelsIn,(ma_uint32)weights[0x1f][0x1f]);
            fVar5 = ma_calculate_channel_position_rectangular_weight(mVar1,mVar2);
            (&accumulation)[(ulong)local_150 * 0x20 + (ulong)(uint)weights[0x1f][0x1f]] = fVar5;
          }
        }
        for (iChannelIn = 0; iChannelIn < frameCount; iChannelIn = iChannelIn + 1) {
          for (local_150 = 0; local_150 < channelsOut; local_150 = local_150 + 1) {
            fStack_1160 = 0.0;
            for (weights[0x1f][0x1f] = 0.0; (uint)weights[0x1f][0x1f] < channelsIn;
                weights[0x1f][0x1f] = (float)((int)weights[0x1f][0x1f] + 1)) {
              fStack_1160 = *(float *)(pChannelMapIn_local + (ulong)(uint)weights[0x1f][0x1f] * 4) *
                            (&accumulation)
                            [(ulong)local_150 * 0x20 + (ulong)(uint)weights[0x1f][0x1f]] +
                            fStack_1160;
            }
            *(float *)(pChannelMapOut_local + (ulong)local_150 * 4) = fStack_1160;
          }
          pChannelMapOut_local = pChannelMapOut_local + (ulong)channelsOut * 4;
          pChannelMapIn_local = pChannelMapIn_local + (ulong)channelsIn * 4;
        }
      }
      else {
        for (iChannelIn = 0; iChannelIn < frameCount; iChannelIn = iChannelIn + 1) {
          for (local_150 = 0; local_150 < channelsOut; local_150 = local_150 + 1) {
            local_1164 = 0.0;
            mVar1 = ma_channel_map_get_channel(pChannelMapOut,channelsOut,local_150);
            for (weights[0x1f][0x1f] = 0.0; (uint)weights[0x1f][0x1f] < channelsIn;
                weights[0x1f][0x1f] = (float)((int)weights[0x1f][0x1f] + 1)) {
              mVar2 = ma_channel_map_get_channel
                                (pChannelMapIn,channelsIn,(ma_uint32)weights[0x1f][0x1f]);
              fVar5 = *(float *)(pChannelMapIn_local + (ulong)(uint)weights[0x1f][0x1f] * 4);
              fVar6 = ma_calculate_channel_position_rectangular_weight(mVar1,mVar2);
              local_1164 = fVar5 * fVar6 + local_1164;
            }
            *(float *)(pChannelMapOut_local + (ulong)local_150 * 4) = local_1164;
          }
          pChannelMapOut_local = pChannelMapOut_local + (ulong)channelsOut * 4;
          pChannelMapIn_local = pChannelMapIn_local + (ulong)channelsIn * 4;
        }
      }
    }
  }
  else {
    ma_silence_pcm_frames(pFramesOut,frameCount,ma_format_f32,channelsOut);
  }
  return;
}

Assistant:

static void ma_channel_map_apply_f32(float* pFramesOut, const ma_channel* pChannelMapOut, ma_uint32 channelsOut, const float* pFramesIn, const ma_channel* pChannelMapIn, ma_uint32 channelsIn, ma_uint64 frameCount, ma_channel_mix_mode mode, ma_mono_expansion_mode monoExpansionMode)
{
    ma_channel_conversion_path conversionPath = ma_channel_map_get_conversion_path(pChannelMapIn, channelsIn, pChannelMapOut, channelsOut, mode);

    /* Optimized Path: Passthrough */
    if (conversionPath == ma_channel_conversion_path_passthrough) {
        ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, ma_format_f32, channelsOut);
        return;
    }

    /* Special Path: Mono Output. */
    if (conversionPath == ma_channel_conversion_path_mono_out) {
        ma_channel_map_apply_mono_out_f32(pFramesOut, pFramesIn, pChannelMapIn, channelsIn, frameCount);
        return;
    }

    /* Special Path: Mono Input. */
    if (conversionPath == ma_channel_conversion_path_mono_in) {
        ma_channel_map_apply_mono_in_f32(pFramesOut, pChannelMapOut, channelsOut, pFramesIn, frameCount, monoExpansionMode);
        return;
    }

    /* Getting here means we aren't running on an optimized conversion path. */
    if (channelsOut <= MA_MAX_CHANNELS) {
        ma_result result;

        if (mode == ma_channel_mix_mode_simple) {
            ma_channel shuffleTable[MA_MAX_CHANNELS];

            result = ma_channel_map_build_shuffle_table(pChannelMapIn, channelsIn, pChannelMapOut, channelsOut, shuffleTable);
            if (result != MA_SUCCESS) {
                return;
            }

            result = ma_channel_map_apply_shuffle_table(pFramesOut, channelsOut, pFramesIn, channelsIn, frameCount, shuffleTable, ma_format_f32);
            if (result != MA_SUCCESS) {
                return;
            }
        } else {
            ma_uint32 iFrame;
            ma_uint32 iChannelOut;
            ma_uint32 iChannelIn;
            float weights[32][32];  /* Do not use MA_MAX_CHANNELS here! */

            /*
            If we have a small enough number of channels, pre-compute the weights. Otherwise we'll just need to
            fall back to a slower path because otherwise we'll run out of stack space.
            */
            if (channelsIn <= ma_countof(weights) && channelsOut <= ma_countof(weights)) {
                /* Pre-compute weights. */
                for (iChannelOut = 0; iChannelOut < channelsOut; iChannelOut += 1) {
                    ma_channel channelOut = ma_channel_map_get_channel(pChannelMapOut, channelsOut, iChannelOut);
                    for (iChannelIn = 0; iChannelIn < channelsIn; iChannelIn += 1) {
                        ma_channel channelIn = ma_channel_map_get_channel(pChannelMapIn, channelsIn, iChannelIn);
                        weights[iChannelOut][iChannelIn] = ma_calculate_channel_position_rectangular_weight(channelOut, channelIn);
                    }
                }

                for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                    for (iChannelOut = 0; iChannelOut < channelsOut; iChannelOut += 1) {
                        float accumulation = 0;

                        for (iChannelIn = 0; iChannelIn < channelsIn; iChannelIn += 1) {
                            accumulation += pFramesIn[iChannelIn] * weights[iChannelOut][iChannelIn];
                        }

                        pFramesOut[iChannelOut] = accumulation;
                    }

                    pFramesOut += channelsOut;
                    pFramesIn  += channelsIn;
                }
            } else {
                /* Cannot pre-compute weights because not enough room in stack-allocated buffer. */
                for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                    for (iChannelOut = 0; iChannelOut < channelsOut; iChannelOut += 1) {
                        float accumulation = 0;
                        ma_channel channelOut = ma_channel_map_get_channel(pChannelMapOut, channelsOut, iChannelOut);

                        for (iChannelIn = 0; iChannelIn < channelsIn; iChannelIn += 1) {
                            ma_channel channelIn = ma_channel_map_get_channel(pChannelMapIn, channelsIn, iChannelIn);
                            accumulation += pFramesIn[iChannelIn] * ma_calculate_channel_position_rectangular_weight(channelOut, channelIn);
                        }

                        pFramesOut[iChannelOut] = accumulation;
                    }

                    pFramesOut += channelsOut;
                    pFramesIn  += channelsIn;
                }
            }
        }
    } else {
        /* Fall back to silence. If you hit this, what are you doing with so many channels?! */
        ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, channelsOut);
    }
}